

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_analysis.cpp
# Opt level: O3

BasicBlock * __thiscall
spvtools::opt::DominatorAnalysisBase::CommonDominator
          (DominatorAnalysisBase *this,BasicBlock *b1,BasicBlock *b2)

{
  _Hash_node_base *p_Var1;
  BasicBlock *pBVar2;
  __hash_code __code;
  BasicBlock *pBVar3;
  pair<std::__detail::_Node_iterator<spvtools::opt::BasicBlock_*,_true,_false>,_bool> pVar4;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  seen;
  BasicBlock *local_70;
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_68;
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_60;
  
  if (b2 == (BasicBlock *)0x0 || b1 == (BasicBlock *)0x0) {
    pBVar3 = (BasicBlock *)0x0;
  }
  else {
    local_60._M_buckets = &local_60._M_single_bucket;
    local_60._M_bucket_count = 1;
    local_60._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_60._M_element_count = 0;
    local_60._M_rehash_policy._M_max_load_factor = 1.0;
    local_60._M_rehash_policy._M_next_resize = 0;
    local_60._M_single_bucket = (__node_base_ptr)0x0;
    local_70 = b1;
    do {
      local_68 = &local_60;
      pVar4 = std::
              _Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<spvtools::opt::BasicBlock*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::BasicBlock*,false>>>>
                        ((_Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)&local_60,&local_70,&local_68);
      pBVar3 = b2;
      if ((((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
         (pBVar3 = b2, local_70 == (BasicBlock *)0x0)) break;
      local_70 = DominatorTree::ImmediateDominator(&this->tree_,local_70);
      pBVar3 = b2;
    } while (local_70 != (BasicBlock *)0x0);
    do {
      local_70 = pBVar3;
      if (local_60._M_buckets[(ulong)local_70 % local_60._M_bucket_count] != (__node_base_ptr)0x0) {
        p_Var1 = local_60._M_buckets[(ulong)local_70 % local_60._M_bucket_count]->_M_nxt;
        pBVar2 = (BasicBlock *)p_Var1[1]._M_nxt;
        do {
          pBVar3 = local_70;
          if (local_70 == pBVar2) goto LAB_001fb0a2;
          p_Var1 = p_Var1->_M_nxt;
        } while ((p_Var1 != (_Hash_node_base *)0x0) &&
                (pBVar2 = (BasicBlock *)p_Var1[1]._M_nxt,
                (ulong)pBVar2 % local_60._M_bucket_count ==
                (ulong)local_70 % local_60._M_bucket_count));
      }
      local_70 = DominatorTree::ImmediateDominator(&this->tree_,local_70);
      pBVar3 = local_70;
    } while (local_70 != (BasicBlock *)0x0);
    pBVar3 = (BasicBlock *)0x0;
LAB_001fb0a2:
    std::
    _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_60);
  }
  return pBVar3;
}

Assistant:

BasicBlock* DominatorAnalysisBase::CommonDominator(BasicBlock* b1,
                                                   BasicBlock* b2) const {
  if (!b1 || !b2) return nullptr;

  std::unordered_set<BasicBlock*> seen;
  BasicBlock* block = b1;
  while (block && seen.insert(block).second) {
    block = ImmediateDominator(block);
  }

  block = b2;
  while (block && !seen.count(block)) {
    block = ImmediateDominator(block);
  }

  return block;
}